

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O0

void __thiscall
AlsavoSession::SendPacket
          (AlsavoSession *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *payload,
          PacketResponseCB *onResponse,uint16_t cmd)

{
  uint32_t _csid;
  uint32_t _dsid;
  uint16_t _cmd;
  size_type sVar1;
  uchar *puVar2;
  uchar *__src;
  undefined1 auStack_5c [8];
  PacketHeader hdr;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> outBuf;
  uint16_t cmd_local;
  PacketResponseCB *onResponse_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *payload_local;
  AlsavoSession *this_local;
  
  outBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = cmd;
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  sVar1 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(payload);
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,sVar1 + 0x10);
  _cmd = outBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_2_;
  _csid = this->m_CSID;
  _dsid = this->m_DSID;
  sVar1 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(payload);
  PacketHeader::PacketHeader((PacketHeader *)auStack_5c,'2',0,_csid,_dsid,_cmd,(uint16_t)sVar1);
  puVar2 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  *(undefined1 (*) [8])puVar2 = auStack_5c;
  *(undefined8 *)(puVar2 + 8) = hdr._0_8_;
  puVar2 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  __src = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(payload);
  sVar1 = CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(payload);
  memcpy(puVar2 + 0x10,__src,sVar1 & 0xffff);
  std::deque<AlsavoSession::PacketQueueItem,std::allocator<AlsavoSession::PacketQueueItem>>::
  emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const&,int)>&>
            ((deque<AlsavoSession::PacketQueueItem,std::allocator<AlsavoSession::PacketQueueItem>> *
             )&this->m_OutQueue,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
             onResponse);
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return;
}

Assistant:

void SendPacket(const std::vector<unsigned char> &payload, PacketResponseCB onResponse, uint16_t cmd = 0xf4)
	{
		std::vector<unsigned char> outBuf;
		outBuf.resize(sizeof(PacketHeader) + payload.size());
		PacketHeader hdr(0x32, 0, m_CSID, m_DSID, cmd, (uint16_t)payload.size());
		memcpy(outBuf.data(), &hdr, sizeof(PacketHeader));
		memcpy(outBuf.data() + sizeof(PacketHeader), payload.data(), (uint16_t)payload.size());
		m_OutQueue.emplace_back(std::move(outBuf), onResponse);
	}